

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlayout.cpp
# Opt level: O1

bool __thiscall QLayout::activate(QLayout *this)

{
  byte bVar1;
  QLayoutPrivate *this_00;
  long lVar2;
  long lVar3;
  Representation minw;
  QSize QVar4;
  QSize QVar5;
  QWidget *this_01;
  bool bVar6;
  uint uVar7;
  ushort uVar8;
  Representation minh;
  long in_FS_OFFSET;
  QSize local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  do {
    this_01 = (QWidget *)this;
    this_00 = *(QLayoutPrivate **)&this_01->field_0x8;
    bVar1 = this_00->field_0x8c;
    if (((bVar1 & 2) == 0) ||
       (this = *(QLayout **)&this_00->field_0x10, (QWidget *)this == (QWidget *)0x0)) {
      bVar6 = false;
      goto LAB_002eb57c;
    }
  } while ((bVar1 & 1) == 0);
  uVar7 = 0;
  bVar6 = false;
  if ((bVar1 & 4) != 0) goto LAB_002eb57c;
  activateRecursiveHelper((QLayoutItem *)&this_01->super_QPaintDevice);
  lVar2 = *(long *)&((QWidget *)this)->field_0x8;
  lVar3 = *(long *)(lVar2 + 0x78);
  if (lVar3 == 0) {
    uVar8 = 0;
  }
  else {
    uVar7 = (uint)*(ushort *)(lVar3 + 0x7c);
    uVar8 = *(ushort *)(lVar3 + 0x7c) & 0xc;
  }
  switch(this_00->constraint) {
  case SetDefaultConstraint:
    if (((((QWidget *)this)->data->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
         super_QFlagsStorage<Qt::WindowType>.i & 1) == 0) {
      if ((~uVar7 & 3) == 0) break;
      QVar4 = QWidget::minimumSize((QWidget *)this);
      minw.m_i = QVar4.wd.m_i.m_i & -(uVar7 & 1);
      minh.m_i = (int)(uVar7 << 0x1e) >> 0x1f & QVar4.ht.m_i.m_i;
    }
    else {
      QVar5 = totalMinimumSize((QLayout *)this_01);
      QVar4 = QVar5;
      if ((uVar7 & 1) != 0) {
        QVar4 = QWidget::minimumSize((QWidget *)this);
      }
      if ((uVar7 & 2) != 0) {
        QVar5 = QWidget::minimumSize((QWidget *)this);
      }
      minw = QVar4.wd.m_i;
      minh = QVar5.ht.m_i;
    }
    goto LAB_002eb6c0;
  case SetMinimumSize:
    QVar4 = totalMinimumSize((QLayout *)this_01);
    minh = QVar4.ht.m_i;
    minw = QVar4.wd.m_i;
LAB_002eb6c0:
    QWidget::setMinimumSize((QWidget *)this,minw.m_i,minh.m_i);
    break;
  case SetFixedSize:
    local_40 = totalSizeHint((QLayout *)this_01);
    QWidget::setFixedSize((QWidget *)this,&local_40);
    break;
  case SetMaximumSize:
    goto switchD_002eb5c3_caseD_4;
  case SetMinAndMaxSize:
    QVar4 = totalMinimumSize((QLayout *)this_01);
    QWidget::setMinimumSize((QWidget *)this,QVar4.wd.m_i.m_i,QVar4.ht.m_i.m_i);
    goto switchD_002eb5c3_caseD_4;
  }
switchD_002eb5c3_caseD_1:
  QLayoutPrivate::doResize(this_00);
  lVar3 = *(long *)(lVar2 + 0x78);
  if (lVar3 != 0) {
    *(ushort *)(lVar3 + 0x7c) = (ushort)*(undefined4 *)(lVar3 + 0x7c) & 0xfffc | (ushort)uVar7 & 3;
    *(ushort *)(*(long *)(lVar2 + 0x78) + 0x7c) =
         uVar8 | (ushort)*(undefined4 *)(*(long *)(lVar2 + 0x78) + 0x7c) & 0xfff3;
  }
  QWidget::updateGeometry((QWidget *)this);
  bVar6 = true;
LAB_002eb57c:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return bVar6;
switchD_002eb5c3_caseD_4:
  QVar4 = totalMaximumSize((QLayout *)this_01);
  QWidget::setMaximumSize((QWidget *)this,QVar4.wd.m_i.m_i,QVar4.ht.m_i.m_i);
  goto switchD_002eb5c3_caseD_1;
}

Assistant:

bool QLayout::activate()
{
    Q_D(QLayout);
    if (!d->enabled || !parent())
        return false;
    if (!d->topLevel)
        return static_cast<QLayout*>(parent())->activate();
    if (d->activated)
        return false;
    QWidget *mw = static_cast<QWidget*>(parent());
    if (Q_UNLIKELY(!mw)) {
        qWarning("QLayout::activate: %s \"%ls\" does not have a main widget",
                 metaObject()->className(), qUtf16Printable(objectName()));
        return false;
    }
    activateRecursiveHelper(this);

    QWidgetPrivate *md = mw->d_func();
    uint explMin = md->extra ? md->extra->explicitMinSize : 0;
    uint explMax = md->extra ? md->extra->explicitMaxSize : 0;

    switch (d->constraint) {
    case SetFixedSize:
        // will trigger resize
        mw->setFixedSize(totalSizeHint());
        break;
    case SetMinimumSize:
        mw->setMinimumSize(totalMinimumSize());
        break;
    case SetMaximumSize:
        mw->setMaximumSize(totalMaximumSize());
        break;
    case SetMinAndMaxSize:
        mw->setMinimumSize(totalMinimumSize());
        mw->setMaximumSize(totalMaximumSize());
        break;
    case SetDefaultConstraint: {
        bool widthSet = explMin & Qt::Horizontal;
        bool heightSet = explMin & Qt::Vertical;
        if (mw->isWindow()) {
            QSize ms = totalMinimumSize();
            if (widthSet)
                ms.setWidth(mw->minimumSize().width());
            if (heightSet)
                ms.setHeight(mw->minimumSize().height());
            mw->setMinimumSize(ms);
        } else if (!widthSet || !heightSet) {
            QSize ms = mw->minimumSize();
            if (!widthSet)
                ms.setWidth(0);
            if (!heightSet)
                ms.setHeight(0);
            mw->setMinimumSize(ms);
        }
        break;
    }
    case SetNoConstraint:
        break;
    }

    d->doResize();

    if (md->extra) {
        md->extra->explicitMinSize = explMin;
        md->extra->explicitMaxSize = explMax;
    }
    // ideally only if sizeHint() or sizePolicy() has changed
    mw->updateGeometry();
    return true;
}